

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O1

int mbedtls_ecdh_make_params
              (mbedtls_ecdh_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  anon_union_320_1_89d318ad_for_ctx *grp;
  int iVar1;
  mbedtls_ecp_point *Q;
  size_t local_48;
  size_t pt_len;
  size_t grp_len;
  
  iVar1 = -0x4f80;
  if (ctx->var == MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0) {
    if (*(long *)((long)&ctx->ctx + 0x78) == 0) {
      iVar1 = -0x4f80;
    }
    else {
      grp = &ctx->ctx;
      grp_len._4_4_ = (uint)ctx->point_format;
      Q = &(ctx->ctx).mbed_ecdh.Q;
      iVar1 = mbedtls_ecdh_gen_public(&(grp->mbed_ecdh).grp,&(ctx->ctx).mbed_ecdh.d,Q,f_rng,p_rng);
      if (((iVar1 == 0) &&
          (iVar1 = mbedtls_ecp_tls_write_group(&(grp->mbed_ecdh).grp,&pt_len,buf,blen), iVar1 == 0))
         && (iVar1 = mbedtls_ecp_tls_write_point
                               (&(grp->mbed_ecdh).grp,Q,grp_len._4_4_,&local_48,buf + pt_len,
                                blen - pt_len), iVar1 == 0)) {
        *olen = local_48 + pt_len;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdh_make_params(mbedtls_ecdh_context *ctx, size_t *olen,
                             unsigned char *buf, size_t blen,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng)
{
    int restart_enabled = 0;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    restart_enabled = ctx->restart_enabled;
#else
    (void) restart_enabled;
#endif

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    return ecdh_make_params_internal(ctx, olen, ctx->point_format, buf, blen,
                                     f_rng, p_rng, restart_enabled);
#else
    switch (ctx->var) {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
            return mbedtls_everest_make_params(&ctx->ctx.everest_ecdh, olen,
                                               buf, blen, f_rng, p_rng);
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            return ecdh_make_params_internal(&ctx->ctx.mbed_ecdh, olen,
                                             ctx->point_format, buf, blen,
                                             f_rng, p_rng,
                                             restart_enabled);
        default:
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }
#endif
}